

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

string * __thiscall
tinyusdz::primvar::PrimVar::type_name_abi_cxx11_(string *__return_storage_ptr__,PrimVar *this)

{
  bool bVar1;
  allocator local_19;
  PrimVar *local_18;
  PrimVar *this_local;
  
  local_18 = this;
  this_local = (PrimVar *)__return_storage_ptr__;
  bVar1 = has_default(this);
  if (bVar1) {
    tinyusdz::value::Value::type_name_abi_cxx11_(__return_storage_ptr__,&this->_value);
  }
  else {
    bVar1 = has_timesamples(this);
    if (bVar1) {
      tinyusdz::value::TimeSamples::type_name_abi_cxx11_(__return_storage_ptr__,&this->_ts);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"[[InvalidType]]",&local_19);
      std::allocator<char>::~allocator((allocator<char> *)&local_19);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string type_name() const {
    if (has_default()) {
      return _value.type_name();
    }
      
    if (has_timesamples()) {
      return _ts.type_name();
    }

    return "[[InvalidType]]";
  }